

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O3

int64_t av1_highbd_pixel_proj_error_c
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  ushort uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  lVar7 = (long)src8 * 2;
  lVar8 = (long)dat8 * 2;
  if (params->r[0] < 1) {
    lVar2 = 4;
    flt0 = flt1;
    flt0_stride = flt1_stride;
    if (params->r[1] < 1) {
      iVar6 = 0;
      if (height < 1) {
        return 0;
      }
      lVar2 = 0;
      do {
        if (0 < width) {
          uVar9 = 0;
          do {
            lVar3 = (ulong)*(ushort *)(lVar8 + uVar9 * 2) - (ulong)*(ushort *)(lVar7 + uVar9 * 2);
            lVar2 = lVar2 + lVar3 * lVar3;
            uVar9 = uVar9 + 1;
          } while ((uint)width != uVar9);
        }
        iVar6 = iVar6 + 1;
        lVar7 = lVar7 + (long)src_stride * 2;
        lVar8 = lVar8 + (long)dat_stride * 2;
      } while (iVar6 != height);
      return lVar2;
    }
  }
  else {
    if (0 < params->r[1]) {
      iVar6 = 0;
      if (height < 1) {
        return 0;
      }
      lVar2 = 0;
      do {
        if (0 < width) {
          uVar9 = 0;
          do {
            uVar1 = *(ushort *)(lVar8 + uVar9 * 2);
            lVar3 = (long)(int)(((uint)uVar1 - (uint)*(ushort *)(lVar7 + uVar9 * 2)) +
                               ((int)((flt1[uVar9] + (uint)uVar1 * -0x10) * xq[1] +
                                      (flt0[uVar9] + (uint)uVar1 * -0x10) * *xq + 0x400) >> 0xb));
            lVar2 = lVar2 + lVar3 * lVar3;
            uVar9 = uVar9 + 1;
          } while ((uint)width != uVar9);
        }
        iVar6 = iVar6 + 1;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        lVar7 = lVar7 + (long)src_stride * 2;
        lVar8 = lVar8 + (long)dat_stride * 2;
      } while (iVar6 != height);
      return lVar2;
    }
    lVar2 = 0;
  }
  iVar6 = 0;
  if (height < 1) {
    return 0;
  }
  lVar3 = 0;
  do {
    if (0 < width) {
      uVar9 = 0;
      do {
        uVar4 = (uint)*(ushort *)(lVar8 + uVar9 * 2);
        lVar5 = (long)(int)((uVar4 - *(ushort *)(lVar7 + uVar9 * 2)) +
                           ((int)((flt0[uVar9] + uVar4 * -0x10) * *(int *)((long)xq + lVar2) + 0x400
                                 ) >> 0xb));
        lVar3 = lVar3 + lVar5 * lVar5;
        uVar9 = uVar9 + 1;
      } while ((uint)width != uVar9);
    }
    iVar6 = iVar6 + 1;
    flt0 = flt0 + flt0_stride;
    lVar7 = lVar7 + (long)src_stride * 2;
    lVar8 = lVar8 + (long)dat_stride * 2;
  } while (iVar6 != height);
  return lVar3;
}

Assistant:

int64_t av1_highbd_pixel_proj_error_c(const uint8_t *src8, int width,
                                      int height, int src_stride,
                                      const uint8_t *dat8, int dat_stride,
                                      int32_t *flt0, int flt0_stride,
                                      int32_t *flt1, int flt1_stride, int xq[2],
                                      const sgr_params_type *params) {
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dat = CONVERT_TO_SHORTPTR(dat8);
  int i, j;
  int64_t err = 0;
  const int32_t half = 1 << (SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS - 1);
  if (params->r[0] > 0 && params->r[1] > 0) {
    int xq0 = xq[0];
    int xq1 = xq[1];
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        const int32_t d = dat[j];
        const int32_t s = src[j];
        const int32_t u = (int32_t)(d << SGRPROJ_RST_BITS);
        int32_t v0 = flt0[j] - u;
        int32_t v1 = flt1[j] - u;
        int32_t v = half;
        v += xq0 * v0;
        v += xq1 * v1;
        const int32_t e = (v >> (SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS)) + d - s;
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
      src += src_stride;
    }
  } else if (params->r[0] > 0 || params->r[1] > 0) {
    int exq;
    int32_t *flt;
    int flt_stride;
    if (params->r[0] > 0) {
      exq = xq[0];
      flt = flt0;
      flt_stride = flt0_stride;
    } else {
      exq = xq[1];
      flt = flt1;
      flt_stride = flt1_stride;
    }
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        const int32_t d = dat[j];
        const int32_t s = src[j];
        const int32_t u = (int32_t)(d << SGRPROJ_RST_BITS);
        int32_t v = half;
        v += exq * (flt[j] - u);
        const int32_t e = (v >> (SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS)) + d - s;
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      flt += flt_stride;
      src += src_stride;
    }
  } else {
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        const int32_t d = dat[j];
        const int32_t s = src[j];
        const int32_t e = d - s;
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
  }
  return err;
}